

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

void arena_i_decay(tsdn_t *tsdn,uint arena_ind,_Bool all)

{
  long lVar1;
  arena_t *paVar2;
  arena_t *in_stack_ffffffffffffffb8;
  tsdn_t *in_stack_ffffffffffffffc0;
  undefined8 *puVar3;
  arena_t *tarena;
  unsigned_long __vla_expr0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  uint uVar5;
  uint i;
  uint narenas;
  _Bool all_local;
  uint arena_ind_local;
  tsdn_t *tsdn_local;
  
  malloc_mutex_lock((tsdn_t *)__vla_expr0,(malloc_mutex_t *)tarena);
  uVar5 = ctl_arenas->narenas;
  if ((arena_ind == 0x1000) || (arena_ind == uVar5)) {
    __vla_expr0 = (unsigned_long)&stack0xffffffffffffffb8;
    lVar1 = -((long)(ulong)uVar5 * 8 + 0xfU & 0xfffffffffffffff0);
    tarena = (arena_t *)(ulong)uVar5;
    puVar3 = (undefined8 *)(&stack0xffffffffffffffb8 + lVar1);
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      *(undefined8 *)(&stack0xffffffffffffffb0 + lVar1) = 0x24dd09c;
      paVar2 = arena_get(*(tsdn_t **)(&stack0xffffffffffffffe0 + lVar1),
                         *(uint *)((long)&__vla_expr0 + lVar1 + 4),
                         *(_Bool *)((long)&__vla_expr0 + lVar1 + 3));
      puVar3[uVar4] = paVar2;
    }
    *(undefined8 *)(&stack0xffffffffffffffb0 + lVar1) = 0x24dd0c5;
    malloc_mutex_unlock(*(tsdn_t **)((long)&tarena + lVar1),
                        *(malloc_mutex_t **)(&stack0xffffffffffffffc8 + lVar1));
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      if (puVar3[uVar4] != 0) {
        *(undefined8 *)(&stack0xffffffffffffffb0 + lVar1) = 0x24dd100;
        duckdb_je_arena_decay
                  (*(tsdn_t **)(&stack0xffffffffffffffc0 + lVar1),
                   *(arena_t **)(&stack0xffffffffffffffb8 + lVar1),
                   (_Bool)(&stack0xffffffffffffffb7)[lVar1],(_Bool)(&stack0xffffffffffffffb6)[lVar1]
                  );
      }
    }
  }
  else {
    paVar2 = arena_get((tsdn_t *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),__vla_expr0._4_4_,
                       __vla_expr0._3_1_);
    malloc_mutex_unlock((tsdn_t *)tarena,(malloc_mutex_t *)paVar2);
    if (paVar2 != (arena_t *)0x0) {
      duckdb_je_arena_decay(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false,false);
    }
  }
  return;
}

Assistant:

static void
arena_i_decay(tsdn_t *tsdn, unsigned arena_ind, bool all) {
	malloc_mutex_lock(tsdn, &ctl_mtx);
	{
		unsigned narenas = ctl_arenas->narenas;

		/*
		 * Access via index narenas is deprecated, and scheduled for
		 * removal in 6.0.0.
		 */
		if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind == narenas) {
			unsigned i;
			VARIABLE_ARRAY_UNSAFE(arena_t *, tarenas, narenas);

			for (i = 0; i < narenas; i++) {
				tarenas[i] = arena_get(tsdn, i, false);
			}

			/*
			 * No further need to hold ctl_mtx, since narenas and
			 * tarenas contain everything needed below.
			 */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			for (i = 0; i < narenas; i++) {
				if (tarenas[i] != NULL) {
					arena_decay(tsdn, tarenas[i], false,
					    all);
				}
			}
		} else {
			arena_t *tarena;

			assert(arena_ind < narenas);

			tarena = arena_get(tsdn, arena_ind, false);

			/* No further need to hold ctl_mtx. */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			if (tarena != NULL) {
				arena_decay(tsdn, tarena, false, all);
			}
		}
	}
}